

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::PrimitiveGen
          (DrawIndirectBase *this,GLenum primitiveType,uint drawSizeX,uint drawSizeY,
          CColorArray *output)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  runtime_error *this_00;
  uint uVar3;
  uint j;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector<float,_4> local_68;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  switch(primitiveType) {
  case 0:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeY * 2));
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    iVar1 = *(int *)CONCAT44(extraout_var_01,iVar1);
    iVar2 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    if (drawSizeY != 0) {
      fVar6 = 2.0 / (float)iVar1;
      local_4c = 2.0 / (float)*(int *)(CONCAT44(extraout_var_02,iVar2) + 4);
      local_48 = local_4c * 0.5;
      fVar7 = fVar6 * 0.5;
      uVar3 = 0;
      local_54 = fVar6;
      local_50 = fVar7;
      do {
        if (drawSizeX != 0) {
          fVar5 = (float)uVar3 * local_4c + -1.0 + local_48;
          uVar4 = 0;
          do {
            local_68.m_data[1] = fVar5;
            local_68.m_data[0] = (float)uVar4 * fVar6 + -1.0 + fVar7;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            uVar4 = uVar4 + 1;
            fVar6 = local_54;
            fVar7 = local_50;
          } while (drawSizeX != uVar4);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != drawSizeY);
    }
    break;
  case 1:
  case 2:
  case 3:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeY * 2));
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    if (drawSizeY != 0) {
      local_54 = 2.0 / (float)*(int *)(CONCAT44(extraout_var,iVar1) + 4);
      local_50 = local_54 * 0.5;
      local_4c = local_54 * 0.0625;
      uVar3 = 0;
      do {
        fVar6 = (float)uVar3 * local_54 + -1.0 + local_50 + local_4c;
        local_68.m_data[1] = fVar6;
        local_68.m_data[0] = -1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[0] = 1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        uVar3 = uVar3 + 1;
      } while (drawSizeY != uVar3);
    }
    break;
  case 4:
  case 5:
  case 6:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeX * 0xc));
    if (drawSizeX != 1) {
      if (drawSizeX != 0) {
        if (drawSizeY == 0) {
          return;
        }
        local_48 = 2.0 / (float)drawSizeX;
        local_44 = 2.0 / (float)drawSizeY;
        uVar3 = 0;
        do {
          local_54 = (float)uVar3 * local_44 + -1.0;
          local_50 = local_44 + local_54;
          uVar4 = 0;
          do {
            fVar6 = (float)uVar4 * local_48 + -1.0;
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_4c = local_48 + fVar6;
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            uVar4 = uVar4 + 1;
          } while (drawSizeX != uVar4);
          uVar3 = uVar3 + 1;
        } while (uVar3 != drawSizeY);
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Invalid drawSizeX!");
      goto LAB_00b7815f;
    }
    local_68.m_data[0] = -1.0;
    local_68.m_data[1] = -1.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    local_68.m_data[0] = 4.0;
    local_68.m_data[1] = -1.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    local_68.m_data[0] = -1.0;
    local_68.m_data[1] = 4.0;
    goto LAB_00b77e80;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown primitive type!");
LAB_00b7815f:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 10:
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    if (drawSizeY != 0) {
      local_50 = 2.0 / (float)*(int *)(CONCAT44(extraout_var_03,iVar1) + 4);
      local_4c = local_50 * 0.5;
      local_48 = local_50 * 0.0625;
      uVar3 = 0;
      do {
        fVar6 = (float)uVar3 * local_50 + -1.0 + local_4c + local_48;
        local_54 = fVar6 + -1.0;
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = -1.5;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = fVar6;
        local_68.m_data[0] = -1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[0] = 1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[1] = local_54;
        local_68.m_data[0] = 1.5;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        uVar3 = uVar3 + 1;
      } while (drawSizeY != uVar3);
    }
    break;
  case 0xb:
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    local_50 = 2.0 / (float)*(int *)(CONCAT44(extraout_var_00,iVar1) + 4);
    local_54 = local_50 * 0.5;
    local_68.m_data[1] = local_54;
    local_68.m_data[0] = -1.5;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    if (drawSizeY != 0) {
      local_4c = local_50 * 0.0625;
      uVar3 = 0;
      do {
        fVar6 = (float)uVar3 * local_50 + -1.0 + local_54 + local_4c;
        local_68.m_data[1] = fVar6;
        local_68.m_data[0] = -1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[0] = -1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[0] = 1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        local_68.m_data[0] = 1.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_68);
        uVar3 = uVar3 + 1;
      } while (drawSizeY != uVar3);
    }
    local_68.m_data[1] = 1.0 - local_54;
    local_68.m_data[0] = 1.5;
LAB_00b77e80:
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_68
              );
    break;
  case 0xc:
    if (drawSizeX != 0) {
      fVar6 = 1.0 / (float)drawSizeX;
      local_40 = 1.0 / (float)drawSizeY;
      uVar3 = 0;
      local_3c = local_40 + local_40;
      local_38 = fVar6 + fVar6;
      local_48 = fVar6;
      do {
        local_54 = (float)uVar3 * local_40 + -0.5;
        if (drawSizeY != 0) {
          local_50 = local_40 + local_54;
          local_44 = local_54 - local_40;
          local_34 = local_3c + local_54;
          uVar4 = 0;
          do {
            fVar6 = (float)uVar4 * fVar6 + -0.5;
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = fVar6 - local_48;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_4c = local_48 + fVar6;
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_44;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_38 + fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_50;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_34;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            uVar4 = uVar4 + 1;
            fVar6 = local_48;
          } while (drawSizeY != uVar4);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != drawSizeX);
    }
    break;
  case 0xd:
    if (drawSizeX != 0) {
      fVar6 = 1.0 / (float)drawSizeX;
      local_40 = 1.0 / (float)drawSizeY;
      uVar3 = 0;
      local_3c = local_40 + local_40;
      local_38 = fVar6 + fVar6;
      local_50 = fVar6;
      do {
        local_48 = (float)uVar3 * local_40 + -0.5;
        if (drawSizeY != 0) {
          local_54 = local_40 + local_48;
          local_44 = local_48 - local_40;
          local_34 = local_3c + local_48;
          uVar4 = 0;
          do {
            fVar6 = (float)uVar4 * fVar6 + -0.5;
            local_68.m_data[1] = local_48;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = fVar6 - local_50;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_4c = local_50 + fVar6;
            local_68.m_data[1] = local_44;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_48;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_34;
            local_68.m_data[0] = fVar6;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_54;
            local_68.m_data[0] = local_4c;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            local_68.m_data[1] = local_44;
            local_68.m_data[0] = fVar6 + local_38;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_68);
            uVar4 = uVar4 + 1;
            fVar6 = local_50;
          } while (drawSizeY != uVar4);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != drawSizeX);
    }
  }
  return;
}

Assistant:

void PrimitiveGen(GLenum primitiveType, unsigned int drawSizeX, unsigned int drawSizeY, CColorArray& output)
	{
		switch (primitiveType)
		{
		case GL_POINTS:
			PointsGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES:
		case GL_LINE_STRIP:
		case GL_LINE_LOOP:
			LinesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES_ADJACENCY:
			LinesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINE_STRIP_ADJACENCY:
			LineStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES:
		case GL_TRIANGLE_STRIP:
		case GL_TRIANGLE_FAN:
			TrianglesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES_ADJACENCY:
			TrianglesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLE_STRIP_ADJACENCY:
			TriangleStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		default:
			throw std::runtime_error("Unknown primitive type!");
			break;
		}
	}